

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_sign
              (secp256k1_ecmult_gen_context *ctx,secp256k1_scalar *sigr,secp256k1_scalar *sigs,
              secp256k1_scalar *seckey,secp256k1_scalar *message,secp256k1_scalar *nonce,int *recid)

{
  uint uVar1;
  uint uVar2;
  secp256k1_scalar *in_RDX;
  secp256k1_scalar *in_RSI;
  uint *in_stack_00000008;
  int high;
  int overflow;
  secp256k1_scalar n;
  secp256k1_ge r;
  secp256k1_gej rp;
  uchar b [32];
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  int iVar3;
  secp256k1_scalar *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  secp256k1_scalar *in_stack_fffffffffffffec0;
  secp256k1_scalar *in_stack_fffffffffffffec8;
  secp256k1_scalar *in_stack_fffffffffffffed0;
  secp256k1_scalar *in_stack_fffffffffffffed8;
  secp256k1_scalar *in_stack_fffffffffffffee0;
  secp256k1_gej *in_stack_fffffffffffffee8;
  secp256k1_ge *in_stack_fffffffffffffef0;
  secp256k1_fe asStack_108 [3];
  secp256k1_scalar *in_stack_ffffffffffffff70;
  secp256k1_gej *in_stack_ffffffffffffff78;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff80;
  uchar local_58 [64];
  secp256k1_scalar *local_18;
  secp256k1_scalar *local_10;
  
  iVar3 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  secp256k1_ecmult_gen
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  secp256k1_ge_set_gej(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  secp256k1_fe_impl_normalize((secp256k1_fe *)&stack0xfffffffffffffed0);
  secp256k1_fe_impl_normalize(asStack_108);
  secp256k1_fe_impl_get_b32(local_58,(secp256k1_fe *)&stack0xfffffffffffffed0);
  secp256k1_scalar_set_b32
            (in_stack_fffffffffffffeb0,(uchar *)CONCAT44(iVar3,in_stack_fffffffffffffea8),
             (int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  if (in_stack_00000008 != (uint *)0x0) {
    uVar1 = iVar3 << 1;
    uVar2 = secp256k1_fe_impl_is_odd(asStack_108);
    *in_stack_00000008 = uVar1 | uVar2;
  }
  secp256k1_scalar_mul
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  secp256k1_scalar_add
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  secp256k1_scalar_inverse
            (in_stack_fffffffffffffec0,
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  secp256k1_scalar_mul
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffeb0);
  secp256k1_gej_clear((secp256k1_gej *)0x10f052);
  secp256k1_ge_clear((secp256k1_ge *)0x10f05c);
  uVar1 = secp256k1_scalar_is_high(local_18);
  secp256k1_scalar_cond_negate(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  if (in_stack_00000008 != (uint *)0x0) {
    *in_stack_00000008 = uVar1 ^ *in_stack_00000008;
  }
  iVar3 = secp256k1_scalar_is_zero(local_10);
  uVar1 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
  iVar3 = secp256k1_scalar_is_zero(local_18);
  return uVar1 & ((iVar3 != 0 ^ 0xffU) & 1);
}

Assistant:

static int secp256k1_ecdsa_sig_sign(const secp256k1_ecmult_gen_context *ctx, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_scalar *seckey, const secp256k1_scalar *message, const secp256k1_scalar *nonce, int *recid) {
    unsigned char b[32];
    secp256k1_gej rp;
    secp256k1_ge r;
    secp256k1_scalar n;
    int overflow = 0;
    int high;

    secp256k1_ecmult_gen(ctx, &rp, nonce);
    secp256k1_ge_set_gej(&r, &rp);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_normalize(&r.y);
    secp256k1_fe_get_b32(b, &r.x);
    secp256k1_scalar_set_b32(sigr, b, &overflow);
    if (recid) {
        /* The overflow condition is cryptographically unreachable as hitting it requires finding the discrete log
         * of some P where P.x >= order, and only 1 in about 2^127 points meet this criteria.
         */
        *recid = (overflow << 1) | secp256k1_fe_is_odd(&r.y);
    }
    secp256k1_scalar_mul(&n, sigr, seckey);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, nonce);
    secp256k1_scalar_mul(sigs, sigs, &n);
    secp256k1_scalar_clear(&n);
    secp256k1_gej_clear(&rp);
    secp256k1_ge_clear(&r);
    high = secp256k1_scalar_is_high(sigs);
    secp256k1_scalar_cond_negate(sigs, high);
    if (recid) {
        *recid ^= high;
    }
    /* P.x = order is on the curve, so technically sig->r could end up being zero, which would be an invalid signature.
     * This is cryptographically unreachable as hitting it requires finding the discrete log of P.x = N.
     */
    return (int)(!secp256k1_scalar_is_zero(sigr)) & (int)(!secp256k1_scalar_is_zero(sigs));
}